

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflateParams(zng_stream *strm,int32_t level,int32_t strategy)

{
  deflate_state *s;
  int iVar1;
  int32_t iVar2;
  uint level_00;
  bool bVar3;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 != 0) {
    return -2;
  }
  level_00 = 6;
  if (level != -1) {
    level_00 = level;
  }
  if (4 < (uint)strategy || 9 < level_00) {
    return -2;
  }
  s = strm->state;
  if (((s->strategy == strategy) &&
      (configuration_table[s->level].func == configuration_table[level_00].func)) ||
     (s->last_flush == -2)) goto LAB_0010697b;
  iVar2 = zng_deflate(strm,5);
  if (iVar2 == -2) {
    iVar2 = -2;
LAB_00106975:
    bVar3 = false;
  }
  else {
    iVar2 = -5;
    if (strm->avail_in != 0) goto LAB_00106975;
    bVar3 = (s->strstart - s->block_start) + s->lookahead == 0;
  }
  if (!bVar3) {
    return iVar2;
  }
LAB_0010697b:
  if (s->level != level_00) {
    if ((s->level == 0) && (s->matches != 0)) {
      if (s->matches == 1) {
        (*functable.slide_hash)(s);
      }
      else {
        memset(s->head,0,0x20000);
      }
      s->matches = 0;
    }
    lm_set_level(s,level_00);
  }
  s->strategy = strategy;
  return 0;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateParams)(PREFIX3(stream) *strm, int32_t level, int32_t strategy) {
    deflate_state *s;
    compress_func func;
    int hook_flush = Z_NO_FLUSH;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    if (level == Z_DEFAULT_COMPRESSION)
        level = 6;
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED)
        return Z_STREAM_ERROR;
    DEFLATE_PARAMS_HOOK(strm, level, strategy, &hook_flush);  /* hook for IBM Z DFLTCC */
    func = configuration_table[s->level].func;

    if (((strategy != s->strategy || func != configuration_table[level].func) && s->last_flush != -2)
        || hook_flush != Z_NO_FLUSH) {
        /* Flush the last buffer. Use Z_BLOCK mode, unless the hook requests a "stronger" one. */
        int flush = RANK(hook_flush) > RANK(Z_BLOCK) ? hook_flush : Z_BLOCK;
        int err = PREFIX(deflate)(strm, flush);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_in || ((int)s->strstart - s->block_start) + s->lookahead || !DEFLATE_DONE(strm, flush))
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1) {
                FUNCTABLE_CALL(slide_hash)(s);
            } else {
                CLEAR_HASH(s);
            }
            s->matches = 0;
        }

        lm_set_level(s, level);
    }
    s->strategy = strategy;
    return Z_OK;
}